

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qshortcut_widgets.cpp
# Opt level: O1

bool correctWidgetContext(ShortcutContext context,QWidget *w,QWidget *active_window)

{
  QGraphicsWidget *w_00;
  bool bVar1;
  bool bVar2;
  uint uVar3;
  QMenuBar *this;
  QPlatformMenuBar *pQVar4;
  QWidget *pQVar5;
  QWidget *pQVar6;
  long lVar7;
  uint uVar8;
  
  if (active_window == (QWidget *)0x0) {
    return false;
  }
  uVar8 = w->data->widget_attributes >> 0xf;
  this = (QMenuBar *)QMetaObject::cast((QObject *)&QMenuBar::staticMetaObject);
  bVar1 = true;
  if ((this != (QMenuBar *)0x0) &&
     (pQVar4 = QMenuBar::platformMenuBar(this), pQVar4 != (QPlatformMenuBar *)0x0)) {
    bVar1 = true;
    if (*(long *)(*(long *)&(this->super_QWidget).field_0x8 + 0x10) == 0) {
      (**(code **)(*(long *)pQVar4 + 0x80))(pQVar4);
      lVar7 = QMetaObject::cast((QObject *)&QWidgetWindow::staticMetaObject);
      bVar1 = lVar7 != 0;
      if (bVar1) {
        if ((*(long *)(lVar7 + 0x28) == 0) || (*(int *)(*(long *)(lVar7 + 0x28) + 4) == 0)) {
          w = (QWidget *)0x0;
        }
        else {
          w = *(QWidget **)(lVar7 + 0x30);
        }
      }
    }
    else {
      uVar8 = 1;
    }
  }
  if (!bVar1) {
    return false;
  }
  if ((uVar8 & 1) == 0) {
    return false;
  }
  if ((w->data->widget_attributes & 1) != 0) {
    return false;
  }
  if (context == WidgetShortcut) {
    pQVar5 = QApplication::focusWidget();
    return w == pQVar5;
  }
  if (context == WidgetWithChildrenShortcut) {
    pQVar5 = QApplication::focusWidget();
    bVar1 = pQVar5 == w;
    if (pQVar5 == (QWidget *)0x0) {
      return bVar1;
    }
    if (pQVar5 == w) {
      return bVar1;
    }
    do {
      uVar8 = (uint)(byte)(pQVar5->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
                          super_QFlagsStorage<Qt::WindowType>.i;
      if (0x12 < uVar8) {
        return bVar1;
      }
      if ((0x40201U >> (uVar8 & 0x1f) & 1) == 0) {
        return bVar1;
      }
      pQVar5 = *(QWidget **)(*(long *)&pQVar5->field_0x8 + 0x10);
      bVar1 = pQVar5 == w;
      if (pQVar5 == (QWidget *)0x0) {
        return bVar1;
      }
    } while (pQVar5 != w);
    return bVar1;
  }
  if (context == ApplicationShortcut) goto LAB_003a4c54;
  pQVar5 = QWidget::window(w);
  lVar7 = *(long *)(*(long *)&pQVar5->field_0x8 + 0x78);
  bVar1 = true;
  if ((lVar7 == 0) || (w_00 = *(QGraphicsWidget **)(lVar7 + 0x10), w_00 == (QGraphicsWidget *)0x0))
  {
    bVar2 = false;
  }
  else {
    bVar2 = correctGraphicsWidgetContext(context,w_00,active_window);
    bVar1 = false;
  }
  if (!bVar1) {
    return bVar2;
  }
  if (pQVar5 != active_window) {
    uVar8 = (active_window->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
            super_QFlagsStorage<Qt::WindowType>.i;
    if ((char)uVar8 == '\t') {
      pQVar6 = QWidget::focusProxy(active_window);
      if (pQVar6 != (QWidget *)0x0) {
        pQVar6 = QWidget::focusProxy(active_window);
        goto LAB_003a4d9d;
      }
    }
    else if (((uVar8 & 0xff) == 0xb) &&
            (pQVar6 = *(QWidget **)(*(long *)&active_window->field_0x8 + 0x10),
            pQVar6 != (QWidget *)0x0)) {
LAB_003a4d9d:
      active_window = QWidget::window(pQVar6);
    }
  }
  pQVar6 = w;
  if ((active_window != pQVar5) &&
     (lVar7 = QMetaObject::cast((QObject *)&QMenuBar::staticMetaObject), lVar7 == 0)) {
    return false;
  }
  do {
    uVar8 = (pQVar6->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
            super_QFlagsStorage<Qt::WindowType>.i;
    uVar3 = uVar8 & 0xff;
    if ((uVar3 == 0x12) || ((uVar8 & 1) != 0)) {
      if (uVar3 == 0x12) {
        for (pQVar5 = QApplication::focusWidget(); (pQVar5 != (QWidget *)0x0 && (pQVar5 != pQVar6));
            pQVar5 = *(QWidget **)(*(long *)&pQVar5->field_0x8 + 0x10)) {
        }
        return pQVar6 == pQVar5;
      }
      break;
    }
    pQVar6 = *(QWidget **)(*(long *)&pQVar6->field_0x8 + 0x10);
  } while (pQVar6 != (QWidget *)0x0);
LAB_003a4c54:
  bVar1 = QApplicationPrivate::tryModalHelper(w,(QWidget **)0x0);
  return bVar1;
}

Assistant:

static bool correctWidgetContext(Qt::ShortcutContext context, QWidget *w, QWidget *active_window)
{
    if (!active_window)
        return false;

    bool visible = w->isVisible();
#if QT_CONFIG(menubar)
    if (auto menuBar = qobject_cast<QMenuBar *>(w)) {
        if (auto *pmb = menuBar->platformMenuBar()) {
            if (menuBar->parentWidget()) {
                visible = true;
            } else {
                if (auto *ww = qobject_cast<QWidgetWindow *>(pmb->parentWindow()))
                    w = ww->widget(); // Good enough since we only care about the window
                else
                    return false; // This is not a QWidget window. We won't deliver
            }
        }
    }
#endif

    if (!visible || !w->isEnabled())
        return false;

    if (context == Qt::ApplicationShortcut)
        return QApplicationPrivate::tryModalHelper(w, nullptr); // true, unless w is shadowed by a modal dialog

    if (context == Qt::WidgetShortcut)
        return w == QApplication::focusWidget();

    if (context == Qt::WidgetWithChildrenShortcut) {
        const QWidget *tw = QApplication::focusWidget();
        while (tw && tw != w && (tw->windowType() == Qt::Widget || tw->windowType() == Qt::Popup || tw->windowType() == Qt::SubWindow))
            tw = tw->parentWidget();
        return tw == w;
    }

    // Below is Qt::WindowShortcut context
    QWidget *tlw = w->window();
#if QT_CONFIG(graphicsview)
    if (auto topData = static_cast<QWidgetPrivate *>(QObjectPrivate::get(tlw))->extra.get()) {
        if (topData->proxyWidget) {
            bool res = correctGraphicsWidgetContext(context, topData->proxyWidget, active_window);
            return res;
        }
    }
#endif

    if (active_window && active_window != tlw) {
        /* if a floating tool window is active, keep shortcuts on the parent working.
         * and if a popup window is active (f.ex a completer), keep shortcuts on the
         * focus proxy working */
        if (active_window->windowType() == Qt::Tool && active_window->parentWidget()) {
            active_window = active_window->parentWidget()->window();
        } else if (active_window->windowType() == Qt::Popup && active_window->focusProxy()) {
            active_window = active_window->focusProxy()->window();
        }
    }

    if (active_window != tlw) {
#if QT_CONFIG(menubar)
        // If the tlw is a QMenuBar then we allow it to proceed as this indicates that
        // the QMenuBar is a parentless one and is therefore used for multiple top level
        // windows in the application. This is common on macOS platforms for example.
        if (!qobject_cast<QMenuBar *>(tlw))
#endif
        return false;
    }

    /* if we live in a MDI subwindow, ignore the event if we are
       not the active document window */
    const QWidget* sw = w;
    while (sw && !(sw->windowType() == Qt::SubWindow) && !sw->isWindow())
        sw = sw->parentWidget();
    if (sw && (sw->windowType() == Qt::SubWindow)) {
        QWidget *focus_widget = QApplication::focusWidget();
        while (focus_widget && focus_widget != sw)
            focus_widget = focus_widget->parentWidget();
        return sw == focus_widget;
    }

#if defined(DEBUG_QSHORTCUTMAP)
    qDebug().nospace() << "..true [Pass-through]";
#endif
    return QApplicationPrivate::tryModalHelper(w, nullptr);
}